

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int rewrite_insn(gen_ctx_t gen_ctx,MIR_insn_t insn,MIR_reg_t base_reg,rewrite_data *data)

{
  undefined1 auVar1 [32];
  byte bVar2;
  bitmap_t pVVar3;
  MIR_reg_t *pMVar4;
  void *pvVar5;
  ulong *puVar6;
  bitmap_t pVVar7;
  VARR_MIR_reg_t *pVVar8;
  ra_ctx *prVar9;
  undefined8 *puVar10;
  undefined8 uVar11;
  MIR_op_t op1;
  MIR_op_t op1_00;
  MIR_op_t op2;
  undefined1 auVar12 [32];
  anon_union_32_12_57d33f68_for_u aVar13;
  undefined1 auVar14 [32];
  anon_union_32_12_57d33f68_for_u aVar15;
  undefined1 auVar16 [32];
  anon_union_32_12_57d33f68_for_u aVar17;
  undefined1 auVar18 [32];
  rewrite_data *prVar19;
  uint uVar20;
  MIR_op_mode_t MVar21;
  int iVar22;
  MIR_type_t MVar23;
  MIR_reg_t MVar24;
  int iVar25;
  ulong uVar26;
  MIR_insn_t_conflict pMVar27;
  int64_t iVar28;
  MIR_insn_t_conflict insn_00;
  MIR_insn_t pMVar29;
  anon_union_32_12_57d33f68_for_u *paVar30;
  undefined1 (*pauVar31) [32];
  uint uVar32;
  ulong uVar33;
  long lVar34;
  MIR_disp_t disp;
  anon_union_32_12_57d33f68_for_u *paVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  MIR_op_t *pMVar39;
  MIR_reg_t *pMVar40;
  ulong uVar41;
  MIR_context_t pMVar42;
  uint uVar43;
  size_t sVar44;
  bool bVar45;
  int out_p;
  MIR_op_t mem_op;
  MIR_reg_t early_clobbered_hard_reg2;
  MIR_reg_t early_clobbered_hard_reg1;
  MIR_op_t out_op;
  MIR_op_t in_op;
  uint local_224;
  ulong local_208;
  int local_1fc;
  rewrite_data *local_1f8;
  MIR_op_t *local_1f0;
  uint local_1e4;
  MIR_context_t local_1e0;
  ulong local_1d8;
  size_t local_1d0;
  MIR_op_t local_1c8;
  MIR_reg_t *local_190;
  MIR_op_t local_188;
  MIR_op_t local_158;
  void *local_128 [2];
  int64_t iStack_118;
  char *pcStack_110;
  undefined8 uStack_108;
  MIR_disp_t MStack_100;
  void *local_f8;
  MIR_insn_t pMStack_f0;
  MIR_insn_t pMStack_e8;
  undefined8 uStack_e0;
  void *pvStack_d8;
  undefined8 uStack_d0;
  int local_c8 [12];
  undefined1 local_98 [16];
  undefined1 auStack_88 [16];
  undefined1 auStack_78 [16];
  
  pMVar42 = gen_ctx->ctx;
  local_1d8 = 0;
  MIR_new_int_op(pMVar42,0);
  MIR_new_int_op(pMVar42,0);
  local_1d0 = MIR_insn_nops(pMVar42,insn);
  local_1f0 = insn->ops;
  local_190 = &insn->ops[0].u.mem.index;
  local_224 = 0xffffffff;
  local_1e4 = 0xffffffff;
  iVar22 = 0;
  local_1f8 = data;
  local_1e0 = pMVar42;
LAB_00170986:
  if (local_1d0 != 0) {
    sVar44 = 0;
    pMVar40 = local_190;
    do {
      MVar21 = MIR_insn_op_mode(pMVar42,insn,sVar44,&local_1fc);
      prVar19 = local_1f8;
      if (((iVar22 != 0) || ((local_1fc != 0 && ((char)pMVar40[-7] != '\v')))) &&
         ((local_1fc == 0 || iVar22 != 1 || ((char)pMVar40[-7] == '\v')))) {
        if ((char)pMVar40[-7] == '\v') {
          uVar41 = (ulong)pMVar40[-1];
          if (uVar41 < 0x22) {
            pVVar3 = gen_ctx->func_used_hard_regs;
            bitmap_expand(pVVar3,uVar41 + 1);
            if (pVVar3 == (bitmap_t)0x0) goto LAB_001720bd;
            *pVVar3->varr = *pVVar3->varr | 1L << (uVar41 & 0x3f);
          }
          uVar41 = (ulong)*pMVar40;
          if (uVar41 < 0x22) {
            pVVar3 = gen_ctx->func_used_hard_regs;
            bitmap_expand(pVVar3,uVar41 + 1);
            if (pVVar3 == (bitmap_t)0x0) goto LAB_001720c2;
            *pVVar3->varr = *pVVar3->varr | 1L << (uVar41 & 0x3f);
          }
          uVar43 = pMVar40[-1];
          uVar41 = (ulong)uVar43;
          if (uVar41 != 0xffffffff) {
            uVar36 = *pMVar40;
            if (uVar36 - 0x22 < 0xffffffdd && 0x21 < uVar43) {
              pVVar8 = gen_ctx->ra_ctx->reg_renumber;
              if (((pVVar8 == (VARR_MIR_reg_t *)0x0) ||
                  (pMVar4 = pVVar8->varr, pMVar4 == (MIR_reg_t *)0x0)) ||
                 (pVVar8->els_num <= uVar41)) goto LAB_001720ae;
              if (0x21 < pMVar4[uVar41]) {
                if (pVVar8->els_num <= (ulong)uVar36) goto LAB_001720db;
                if (0x21 < pMVar4[uVar36]) {
                  if (local_1fc == 0) {
                    bVar45 = -1 < (int)local_224;
                    uVar32 = local_1e4;
                    uVar20 = local_1e4;
                    local_224 = (uint)sVar44;
                    if (bVar45) {
                      __assert_fail("in_mem_op_num < 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1f5f,
                                    "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                                   );
                    }
                  }
                  else {
                    uVar32 = local_224;
                    uVar20 = (uint)sVar44;
                    if (-1 < (int)local_1e4) {
                      __assert_fail("out_mem_op_num < 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1f5b,
                                    "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                                   );
                    }
                  }
                  local_1e4 = uVar20;
                  if ((((int)uVar32 < 0) || (uVar43 != local_1f0[uVar32].u.mem.base)) ||
                     (uVar36 != local_1f0[uVar32].u.mem.index)) {
                    local_1d8 = (ulong)((int)local_1d8 + 2);
                  }
                }
              }
            }
          }
          if (local_1f8 != (rewrite_data *)0x0) {
            if (uVar43 != 0xffffffff) {
              update_live(uVar43,0,local_1f8->live);
              uVar41 = (ulong)pMVar40[-1];
              if (0x21 < uVar41) {
                pVVar3 = local_1f8->regs_to_save;
                if (pVVar3 == (bitmap_t)0x0) goto LAB_001720d6;
                if ((uVar41 < pVVar3->els_num << 6) &&
                   (uVar43 = pMVar40[-1] >> 6, uVar26 = pVVar3->varr[uVar43],
                   pVVar3->varr[uVar43] = uVar26 & ~(1L << (uVar41 & 0x3f)),
                   (uVar26 >> (uVar41 & 0x3f) & 1) != 0)) {
                  spill_restore_reg(gen_ctx,pMVar40[-1],base_reg,insn,1,0);
                }
              }
            }
            prVar19 = local_1f8;
            pMVar42 = local_1e0;
            if (*pMVar40 != 0xffffffff) {
              update_live(*pMVar40,0,local_1f8->live);
              pMVar42 = local_1e0;
              uVar41 = (ulong)*pMVar40;
              if (0x21 < uVar41) {
                pVVar3 = prVar19->regs_to_save;
                if (pVVar3 == (bitmap_t)0x0) goto LAB_001720d1;
                if ((uVar41 < pVVar3->els_num << 6) &&
                   (uVar43 = *pMVar40 >> 6, uVar26 = pVVar3->varr[uVar43],
                   pVVar3->varr[uVar43] = uVar26 & ~(1L << (uVar41 & 0x3f)),
                   (uVar26 >> (uVar41 & 0x3f) & 1) != 0)) {
                  spill_restore_reg(gen_ctx,*pMVar40,base_reg,insn,1,0);
                }
              }
            }
          }
        }
        else if ((char)pMVar40[-7] == '\x02') {
          uVar41 = (ulong)*(uint *)(pMVar40 + -5);
          if (uVar41 < 0x22) {
            pVVar3 = gen_ctx->func_used_hard_regs;
            bitmap_expand(pVVar3,uVar41 + 1);
            if (pVVar3 == (bitmap_t)0x0) goto LAB_001720b8;
            *pVVar3->varr = *pVVar3->varr | 1L << (uVar41 & 0x3f);
            if (local_1f8 != (rewrite_data *)0x0) {
              update_live(*(MIR_reg_t *)(pMVar40 + -5),local_1fc,local_1f8->live);
            }
          }
          else {
            if (local_1fc == 0) {
              pVVar8 = gen_ctx->ra_ctx->reg_renumber;
              if (((pVVar8 == (VARR_MIR_reg_t *)0x0) || (pVVar8->varr == (MIR_reg_t *)0x0)) ||
                 (pVVar8->els_num <= uVar41)) goto LAB_001720b3;
              if (0x21 < pVVar8->varr[uVar41]) {
                local_1d8 = (ulong)((int)local_1d8 + (uint)(MVar21 - MIR_OP_REF < 0xfffffffd));
              }
            }
            pMVar42 = local_1e0;
            if (local_1f8 != (rewrite_data *)0x0) {
              update_live(*(uint *)(pMVar40 + -5),local_1fc,local_1f8->live);
              pMVar42 = local_1e0;
              pVVar3 = prVar19->regs_to_save;
              if (pVVar3 == (bitmap_t)0x0) goto LAB_001720cc;
              uVar41 = (ulong)*(uint *)(pMVar40 + -5);
              if ((uVar41 < pVVar3->els_num << 6) &&
                 (uVar43 = *(uint *)(pMVar40 + -5) >> 6, uVar26 = pVVar3->varr[uVar43],
                 pVVar3->varr[uVar43] = uVar26 & ~(1L << (uVar41 & 0x3f)),
                 (uVar26 >> (uVar41 & 0x3f) & 1) != 0)) {
                spill_restore_reg(gen_ctx,*(MIR_reg_t *)(pMVar40 + -5),base_reg,insn,1,0);
              }
            }
          }
        }
      }
      sVar44 = sVar44 + 1;
      pMVar40 = pMVar40 + 0xc;
    } while (local_1d0 != sVar44);
  }
  prVar19 = local_1f8;
  if (iVar22 != 0 || local_1f8 == (rewrite_data *)0x0) goto LAB_00171238;
  target_get_early_clobbered_hard_regs(insn,(MIR_reg_t *)&local_158,(MIR_reg_t *)&local_188);
  if ((MIR_reg_t)local_158.data != 0xffffffff) {
    update_live((MIR_reg_t)local_158.data,1,prVar19->live);
  }
  if ((MIR_reg_t)local_188.data != 0xffffffff) {
    update_live((MIR_reg_t)local_188.data,1,prVar19->live);
  }
  if (*(int *)&insn->field_0x18 - 0xaaU < 0xfffffffd) goto LAB_00171238;
  pVVar3 = gen_ctx->call_used_hard_regs[0x12];
  if (pVVar3 != (bitmap_t)0x0) {
    pvVar5 = insn->data;
    uVar41 = 0;
    do {
      prVar19 = local_1f8;
      uVar33 = uVar41 >> 6;
      uVar26 = pVVar3->els_num;
      bVar45 = true;
      uVar37 = uVar41;
      if (uVar33 < uVar26) {
        uVar37 = uVar26 << 6;
LAB_00170f18:
        if ((pVVar3->varr[uVar33] == 0) ||
           (uVar38 = pVVar3->varr[uVar33] >> (uVar41 & 0x3f), uVar38 == 0)) goto LAB_00170f2b;
        uVar26 = uVar38 & 1;
        local_208 = uVar41;
        while (uVar26 == 0) {
          local_208 = local_208 + 1;
          uVar26 = uVar38 & 2;
          uVar38 = uVar38 >> 1;
        }
        uVar37 = local_208 + 1;
        bVar45 = false;
      }
LAB_00170f64:
      if (bVar45) goto LAB_00170f94;
      update_live((MIR_reg_t)local_208,1,local_1f8->live);
      uVar41 = uVar37;
      if (pVVar3 == (bitmap_t)0x0) break;
    } while( true );
  }
  rewrite_insn_cold_16();
  goto LAB_0017209a;
LAB_00170f2b:
  uVar33 = uVar33 + 1;
  uVar41 = uVar33 * 0x40;
  if (uVar26 == uVar33) goto LAB_00170f64;
  goto LAB_00170f18;
LAB_00170f94:
  puVar6 = *(ulong **)((long)pvVar5 + 0x48);
  if (puVar6 != (ulong *)0x0) {
    uVar41 = 0;
    do {
      uVar33 = uVar41 >> 6;
      uVar26 = *puVar6;
      bVar45 = true;
      uVar37 = uVar41;
      if (uVar33 < uVar26) {
        uVar37 = uVar26 << 6;
LAB_00170fc9:
        uVar38 = *(ulong *)(puVar6[2] + uVar33 * 8);
        if ((uVar38 == 0) || (uVar38 = uVar38 >> (uVar41 & 0x3f), uVar38 == 0)) goto LAB_00170fdc;
        uVar26 = uVar38 & 1;
        local_208 = uVar41;
        while (uVar26 == 0) {
          local_208 = local_208 + 1;
          uVar26 = uVar38 & 2;
          uVar38 = uVar38 >> 1;
        }
        uVar37 = local_208 + 1;
        bVar45 = false;
      }
LAB_00171015:
      if (bVar45) goto LAB_0017103a;
      update_live((MIR_reg_t)local_208,0,prVar19->live);
      uVar41 = uVar37;
      if (puVar6 == (ulong *)0x0) break;
    } while( true );
  }
LAB_0017209a:
  rewrite_insn_cold_15();
LAB_0017209f:
  rewrite_insn_cold_14();
LAB_001720a4:
  rewrite_insn_cold_12();
LAB_001720a9:
  rewrite_insn_cold_13();
LAB_001720ae:
  rewrite_insn_cold_2();
LAB_001720b3:
  rewrite_insn_cold_8();
LAB_001720b8:
  rewrite_insn_cold_9();
LAB_001720bd:
  rewrite_insn_cold_6();
LAB_001720c2:
  rewrite_insn_cold_5();
LAB_001720c7:
  rewrite_insn_cold_11();
LAB_001720cc:
  rewrite_insn_cold_7();
LAB_001720d1:
  rewrite_insn_cold_4();
LAB_001720d6:
  rewrite_insn_cold_3();
LAB_001720db:
  rewrite_insn_cold_1();
LAB_001720e0:
  rewrite_insn_cold_10();
  goto LAB_001720e5;
LAB_00170fdc:
  uVar33 = uVar33 + 1;
  uVar41 = uVar33 * 0x40;
  if (uVar26 == uVar33) goto LAB_00171015;
  goto LAB_00170fc9;
LAB_0017103a:
  pVVar3 = prVar19->live;
  if (pVVar3 != (bitmap_t)0x0) {
    uVar41 = 0;
    do {
      uVar33 = uVar41 >> 6;
      uVar26 = pVVar3->els_num;
      bVar45 = true;
      uVar37 = uVar41;
      if (uVar33 < uVar26) {
        uVar37 = uVar26 << 6;
LAB_00171068:
        if ((pVVar3->varr[uVar33] == 0) ||
           (uVar38 = pVVar3->varr[uVar33] >> (uVar41 & 0x3f), uVar38 == 0)) goto LAB_0017107b;
        uVar26 = uVar38 & 1;
        local_208 = uVar41;
        while (uVar26 == 0) {
          local_208 = local_208 + 1;
          uVar26 = uVar38 & 2;
          uVar38 = uVar38 >> 1;
        }
        uVar37 = local_208 + 1;
        bVar45 = false;
      }
LAB_001710b4:
      if (bVar45) goto LAB_00171238;
      if (0x21 < local_208) {
        pVVar7 = local_1f8->bb->gen;
        if (pVVar7 == (bitmap_t)0x0) goto LAB_001720a9;
        uVar41 = local_208 & 0xffffffff;
        if ((pVVar7->els_num << 6 <= uVar41) ||
           ((pVVar7->varr[(uint)local_208 >> 6] >> (local_208 & 0x3f) & 1) == 0)) {
          pVVar8 = gen_ctx->ra_ctx->reg_renumber;
          if ((pVVar8 == (VARR_MIR_reg_t *)0x0) ||
             ((pVVar8->varr == (MIR_reg_t *)0x0 || (pVVar8->els_num <= uVar41)))) goto LAB_001720a4;
          uVar26 = (ulong)pVVar8->varr[uVar41];
          if (uVar26 < 0x22) {
            MIR_reg_type(gen_ctx->ctx,(uint)local_208 - 0x21,(gen_ctx->curr_func_item->u).func);
            pMVar42 = local_1e0;
            pVVar7 = gen_ctx->call_used_hard_regs[0x12];
            if (pVVar7 == (bitmap_t)0x0) goto LAB_001720c7;
            if ((uVar26 < pVVar7->els_num << 6) && ((*pVVar7->varr >> (uVar26 & 0x3f) & 1) != 0)) {
              pVVar7 = local_1f8->regs_to_save;
              bitmap_expand(pVVar7,uVar41 + 1);
              if (pVVar7 == (bitmap_t)0x0) goto LAB_001720e0;
              uVar41 = pVVar7->varr[(uint)local_208 >> 6];
              pVVar7->varr[(uint)local_208 >> 6] = uVar41 | 1L << (local_208 & 0x3f);
              if ((uVar41 >> (local_208 & 0x3f) & 1) == 0) {
                spill_restore_reg(gen_ctx,(uint)local_208,base_reg,insn,1,1);
              }
            }
          }
        }
      }
      uVar41 = uVar37;
      if (pVVar3 == (bitmap_t)0x0) break;
    } while( true );
  }
  goto LAB_0017209f;
LAB_0017107b:
  uVar33 = uVar33 + 1;
  uVar41 = uVar33 * 0x40;
  if (uVar26 == uVar33) goto LAB_001710b4;
  goto LAB_00171068;
LAB_00171238:
  bVar45 = iVar22 != 0;
  iVar22 = iVar22 + 1;
  if (bVar45) goto code_r0x00171245;
  goto LAB_00170986;
code_r0x00171245:
  prVar9 = gen_ctx->ra_ctx;
  prVar9->in_reloads_num = 0;
  prVar9->out_reloads_num = 0;
  if (2 < (int)local_1d8) {
    if ((int)(local_224 & local_1e4) < 0) {
      __assert_fail("in_mem_op_num >= 0 || out_mem_op_num >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1ebb,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
    }
    pMVar42 = gen_ctx->ctx;
    uVar43 = local_224;
    if (-1 < (int)local_1e4) {
      uVar43 = local_1e4;
    }
    uVar26 = (ulong)local_1f0[(int)uVar43].u.mem.base;
    uVar33 = (ulong)local_1f0[(int)uVar43].u.mem.index;
    uVar41 = (ulong)local_224;
    uVar37 = (ulong)local_1e4;
    if (-1 < (int)(local_224 | local_1e4)) {
      pMVar39 = local_1f0 + uVar41;
      uVar11 = *(undefined8 *)((long)&pMVar39->u + 8);
      op1._12_4_ = (int)((ulong)*(undefined8 *)&pMVar39->field_0x8 >> 0x20);
      op1.data = pMVar39->data;
      op1._8_4_ = *(undefined4 *)&pMVar39->field_0x8;
      op1.u.i = (pMVar39->u).i;
      op1.u.mem.nonalias = (int)uVar11;
      op1.u.mem.nloc = (int)((ulong)uVar11 >> 0x20);
      op1.u._16_8_ = *(undefined8 *)((long)&local_1f0[uVar41].u + 0x10);
      op1.u.mem.disp = local_1f0[uVar41].u.mem.disp;
      op2.u._16_8_ = *(undefined8 *)((long)&local_1f0[uVar37].u + 0x10);
      op2._0_32_ = *(undefined1 (*) [32])(local_1f0 + uVar37);
      op2.u.mem.disp = local_1f0[uVar37].u.mem.disp;
      iVar22 = MIR_op_eq_p(pMVar42,op1,op2);
      if (iVar22 == 0) {
        __assert_fail("in_mem_op_num < 0 || out_mem_op_num < 0 || MIR_op_eq_p (ctx, ops[in_mem_op_num], ops[out_mem_op_num])"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1ec0,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
      }
    }
    pVVar8 = gen_ctx->ra_ctx->reg_renumber;
    if (((pVVar8 == (VARR_MIR_reg_t *)0x0) || (pVVar8->varr == (MIR_reg_t *)0x0)) ||
       (pVVar8->els_num <= uVar26)) {
      rewrite_insn_cold_20();
    }
    else {
      add_ld_st(gen_ctx,&local_158,pVVar8->varr[uVar26],base_reg,MIR_OP_INT,10,0,10,insn,0);
      pMVar39 = local_1f0;
      pVVar8 = gen_ctx->ra_ctx->reg_renumber;
      if (((pVVar8 != (VARR_MIR_reg_t *)0x0) && (pVVar8->varr != (MIR_reg_t *)0x0)) &&
         (uVar33 < pVVar8->els_num)) {
        add_ld_st(gen_ctx,&local_158,pVVar8->varr[uVar33],base_reg,MIR_OP_INT,0xb,0,0xb,insn,0);
        _MIR_new_var_op(pMVar42,10);
        _MIR_new_var_op(pMVar42,0xb);
        bVar2 = pMVar39[(int)uVar43].u.mem.scale;
        uVar26 = (ulong)bVar2;
        if (bVar2 == 0) {
          iVar28 = -1;
LAB_00171476:
          MIR_new_int_op(pMVar42,iVar28);
          pMVar27 = MIR_new_insn(pMVar42,MIR_LSH);
          gen_add_insn_before(gen_ctx,insn,pMVar27);
          if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
            fwrite("      ",6,1,(FILE *)gen_ctx->debug_file);
            MIR_output_insn(pMVar42,gen_ctx->debug_file,pMVar27,(gen_ctx->curr_func_item->u).func,1)
            ;
          }
        }
        else if (bVar2 != 1) {
          lVar34 = 0;
          uVar33 = uVar26;
          if ((bVar2 & 1) == 0) {
            do {
              lVar34 = lVar34 + 1;
              uVar26 = uVar33 >> 1;
              uVar38 = uVar33 & 2;
              uVar33 = uVar26;
            } while (uVar38 == 0);
          }
          iVar28 = -1;
          if (uVar26 == 1) {
            iVar28 = lVar34;
          }
          goto LAB_00171476;
        }
        pMVar27 = MIR_new_insn(pMVar42,MIR_ADD);
        gen_add_insn_before(gen_ctx,insn,pMVar27);
        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          fwrite("      ",6,1,(FILE *)gen_ctx->debug_file);
          MIR_output_insn(pMVar42,gen_ctx->debug_file,pMVar27,(gen_ctx->curr_func_item->u).func,1);
        }
        if (-1 < (int)local_1e4) {
          *(undefined8 *)((long)&local_1f0[uVar37].u + 0x10) = 0xffffffff0000000a;
        }
        if (-1 < (int)local_224) {
          *(undefined8 *)((long)&local_1f0[uVar41].u + 0x10) = 0xffffffff0000000a;
        }
        get_reload_hreg(gen_ctx,0xffffffff,6,0);
        goto LAB_0017165a;
      }
    }
    rewrite_insn_cold_19();
LAB_00172195:
    rewrite_insn_cold_17();
LAB_0017219a:
    __assert_fail("insn->code == MIR_USE || (MIR_addr_code_p (insn->code) && i == 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1fb5,
                  "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)");
  }
LAB_0017165a:
  bVar45 = *(int *)&insn->field_0x18 - 0x22U < 0xfffffffc;
  if (!bVar45) {
    if (bVar45) {
      __assert_fail("MIR_addr_code_p (insn->code)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1f03,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
    }
    if (*(char *)&insn[1].insn_link.prev != '\x02') {
      __assert_fail("insn->ops[1].mode == MIR_OP_VAR",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1f04,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
    }
    uVar43 = *(uint *)&insn[1].insn_link.next;
    if (0xffffffdc < uVar43 - 0x22) {
      __assert_fail("reg > ST1_HARD_REG && reg != (4294967295U)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1f06,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
    }
    pVVar8 = gen_ctx->ra_ctx->reg_renumber;
    if (((pVVar8 == (VARR_MIR_reg_t *)0x0) || (pVVar8->varr == (MIR_reg_t *)0x0)) ||
       (pVVar8->els_num <= (ulong)uVar43)) goto LAB_00172195;
    pMVar42 = gen_ctx->ctx;
    uVar36 = pVVar8->varr[uVar43];
    MVar23 = MIR_reg_type(pMVar42,uVar43 - 0x21,(gen_ctx->curr_func_item->u).func);
    if (uVar36 < 0x22) {
      __assert_fail("loc > ST1_HARD_REG",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1f09,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
    }
    uVar36 = uVar36 - 0x22;
    if (gen_ctx->target_ctx->keep_fp_p == '\0') {
      lVar34 = (ulong)uVar36 << 3;
    }
    else {
      lVar34 = -0xb0;
      if (((gen_ctx->curr_func_item->u).func)->vararg_p == '\0') {
        lVar34 = 0;
      }
      lVar34 = lVar34 + (ulong)((MVar23 == MIR_T_LD) + 1 + uVar36) * -8;
    }
    MVar24 = get_reload_hreg(gen_ctx,0xffffffff,6,0);
    _MIR_new_var_op(pMVar42,MVar24);
    iVar28 = _MIR_addr_offset(pMVar42,*(MIR_insn_code_t *)&insn->field_0x18);
    MIR_new_int_op(pMVar42,lVar34 + iVar28);
    pMVar27 = MIR_new_insn(pMVar42,MIR_MOV);
    _MIR_new_var_op(pMVar42,MVar24);
    _MIR_new_var_op(pMVar42,MVar24);
    _MIR_new_var_op(pMVar42,base_reg);
    insn_00 = MIR_new_insn(pMVar42,MIR_ADD);
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      if (gen_ctx->optimize_level == 0) {
        uVar43 = *(int *)&insn->field_0x18 - 0xa7;
        pMVar29 = insn;
        if ((uVar43 < 0xe) && ((0x2007U >> (uVar43 & 0x1f) & 1) != 0)) {
          pMVar29 = (MIR_insn_t)insn->data;
        }
      }
      else {
        pMVar29 = (MIR_insn_t)((long)insn->data + 0x30);
      }
      fprintf((FILE *)gen_ctx->debug_file,"    Adding before insn (in BB %lu) ",*pMVar29->data);
      MIR_output_insn(pMVar42,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,0);
      fwrite(":\n      ",8,1,(FILE *)gen_ctx->debug_file);
      MIR_output_insn(pMVar42,gen_ctx->debug_file,pMVar27,(gen_ctx->curr_func_item->u).func,1);
      fwrite("      ",6,1,(FILE *)gen_ctx->debug_file);
      MIR_output_insn(pMVar42,gen_ctx->debug_file,insn_00,(gen_ctx->curr_func_item->u).func,1);
    }
    gen_add_insn_before(gen_ctx,insn,pMVar27);
    gen_add_insn_before(gen_ctx,insn,insn_00);
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("Changing ",9,1,(FILE *)gen_ctx->debug_file);
      MIR_output_insn(pMVar42,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,0);
    }
    *(undefined4 *)&insn->field_0x18 = 0;
    _MIR_new_var_op(pMVar42,MVar24);
    auVar1._16_16_ = auStack_88;
    auVar1._0_16_ = local_98;
    auVar18._16_16_ = auStack_78;
    auVar18._0_16_ = auStack_88;
    *(undefined1 (*) [32])&insn[1].insn_link.next = auVar18;
    insn[1].data = (void *)local_98._0_8_;
    insn[1].insn_link.prev = (MIR_insn_t)SUB168(auVar1._8_16_,0);
    insn[1].insn_link.next = (MIR_insn_t)SUB168(auVar1._8_16_,8);
    *(long *)&insn[1].field_0x18 = auStack_88._8_8_;
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite(" to ",4,1,(FILE *)gen_ctx->debug_file);
      MIR_output_insn(pMVar42,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,1);
    }
  }
  if (local_1d0 != 0) {
    uVar43 = *(int *)&insn->field_0x18 - 0xaa;
    paVar30 = &insn->ops[0].u;
    sVar44 = 0;
    local_1f8 = (rewrite_data *)CONCAT44(local_1f8._4_4_,uVar43);
    do {
      pMVar39 = local_1f0 + sVar44;
      MVar21 = MIR_insn_op_mode(local_1e0,insn,sVar44,&local_1fc);
      if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        pauVar31 = (undefined1 (*) [32])local_128;
        if (local_1fc == 0) {
          pauVar31 = (undefined1 (*) [32])&local_f8;
        }
        auVar1 = *(undefined1 (*) [32])pMVar39;
        *(anon_union_32_12_57d33f68_for_u *)(*pauVar31 + 0x10) = pMVar39->u;
        *pauVar31 = auVar1;
      }
      if (pMVar39->field_0x8 == '\v') {
        if ((uVar43 < 0xfffffffd) || (*(byte *)&pMVar39->u - 0x11 < 0xfffffffb)) {
          MVar24 = *(MIR_reg_t *)((long)&pMVar39->u + 0x10);
          if (0x22 < MVar24 + 1) {
            MVar24 = change_reg(gen_ctx,&local_1c8,MVar24,base_reg,MIR_OP_INT,insn,0);
            *(MIR_reg_t *)((long)&pMVar39->u + 0x10) = MVar24;
            if (MVar24 == 0xffffffff) {
              __assert_fail("op->u.var_mem.base != (4294967295U)",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x1fcc,
                            "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                           );
            }
          }
          MVar24 = (pMVar39->u).mem.index;
          if (0x22 < MVar24 + 1) {
            MVar24 = change_reg(gen_ctx,&local_1c8,MVar24,base_reg,MIR_OP_INT,insn,0);
            (pMVar39->u).mem.index = MVar24;
            if (MVar24 == 0xffffffff) {
              __assert_fail("op->u.var_mem.index != (4294967295U)",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x1fd1,
                            "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                           );
            }
          }
        }
      }
      else if ((pMVar39->field_0x8 == '\x02') && (0x21 < (pMVar39->u).reg)) {
        if (MVar21 == MIR_OP_VAR) {
          if ((*(int *)&insn->field_0x18 != 0xb9) &&
             ((sVar44 != 1 || (3 < *(int *)&insn->field_0x18 - 0x1eU)))) goto LAB_0017219a;
          MVar23 = MIR_reg_type(local_1e0,(pMVar39->u).reg - 0x21,(gen_ctx->curr_func_item->u).func)
          ;
          if (MVar23 == MIR_T_F) {
            MVar21 = MIR_OP_FLOAT;
          }
          else if (MVar23 == MIR_T_D) {
            MVar21 = MIR_OP_DOUBLE;
          }
          else {
            MVar21 = (uint)(MVar23 == MIR_T_LD) * 4 + MIR_OP_INT;
          }
        }
        pVVar8 = gen_ctx->ra_ctx->reg_renumber;
        if (((pVVar8 == (VARR_MIR_reg_t *)0x0) || (pVVar8->varr == (MIR_reg_t *)0x0)) ||
           (pVVar8->els_num <= (ulong)(pMVar39->u).reg)) {
LAB_001720e5:
          rewrite_insn_cold_18();
LAB_001720ed:
          __assert_fail("n < 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x1ef5,
                        "int try_spilled_reg_mem(gen_ctx_t, MIR_insn_t, int, MIR_reg_t, MIR_reg_t)")
          ;
        }
        if (((sVar44 == 0) && (*(int *)&insn->field_0x18 - 0x22U < 0xfffffffc)) &&
           (uVar36 = pVVar8->varr[(pMVar39->u).reg], 0x21 < uVar36)) {
          pMVar42 = gen_ctx->ctx;
          MVar23 = MIR_reg_type(pMVar42,paVar30->reg - 0x21,(gen_ctx->curr_func_item->u).func);
          uVar36 = uVar36 - 0x22;
          if (gen_ctx->target_ctx->keep_fp_p == '\0') {
            disp = (ulong)uVar36 << 3;
          }
          else {
            lVar34 = -0xb0;
            if (((gen_ctx->curr_func_item->u).func)->vararg_p == '\0') {
              lVar34 = 0;
            }
            disp = lVar34 + (ulong)((MVar23 == MIR_T_LD) + 1 + uVar36) * -8;
          }
          MVar24 = insn->ops[0].u.reg;
          auVar1 = *(undefined1 (*) [32])local_1f0;
          local_158.u._16_8_ = SUB328((local_1f0->u).mem,0x10);
          local_158.u.mem.disp = (local_1f0->u).mem.disp;
          local_158.data._0_4_ = auVar1._0_4_;
          local_158.data._4_4_ = auVar1._4_4_;
          local_158._8_8_ = auVar1._8_8_;
          local_158.u.i = auVar1._16_8_;
          local_158.u.str.s = auVar1._24_8_;
          _MIR_new_var_mem_op(&local_188,pMVar42,MVar23,disp,base_reg,0xffffffff,'\0');
          uVar41 = *(ulong *)&insn->field_0x18;
          if ((int)(uVar41 >> 0x20) < 1) {
            uVar43 = 0;
          }
          else {
            uVar26 = 0;
            uVar43 = 0;
            paVar35 = paVar30;
            do {
              if ((*(char *)((long)paVar35 + -8) == '\x02') && (paVar35->reg == MVar24)) {
                auVar14._4_4_ = local_188.data._4_4_;
                auVar14._0_4_ = (MIR_reg_t)local_188.data;
                auVar14._8_8_ = local_188._8_8_;
                auVar14._16_8_ = local_188.u.i;
                auVar14._24_8_ = local_188.u.str.s;
                aVar15.str.s = local_188.u.str.s;
                aVar15.i = local_188.u.i;
                aVar15._16_8_ = local_188.u._16_8_;
                aVar15.mem.disp = local_188.u.mem.disp;
                *paVar35 = aVar15;
                *(undefined1 (*) [32])((long)paVar35 + -0x10) = auVar14;
                if (1 < (int)uVar43) goto LAB_001720ed;
                lVar34 = (long)(int)uVar43;
                uVar43 = uVar43 + 1;
                local_c8[lVar34] = (int)uVar26;
              }
              uVar26 = uVar26 + 1;
              paVar35 = (anon_union_32_12_57d33f68_for_u *)((long)paVar35 + 0x30);
            } while (uVar41 >> 0x20 != uVar26);
          }
          iVar22 = find_insn_pattern(gen_ctx,insn,(int *)0x0);
          if (0 < (int)uVar43 && iVar22 < 0) {
            uVar41 = 0;
            do {
              iVar25 = local_c8[uVar41];
              auVar16._4_4_ = local_158.data._4_4_;
              auVar16._0_4_ = (MIR_reg_t)local_158.data;
              auVar16._8_8_ = local_158._8_8_;
              auVar16._16_8_ = local_158.u.i;
              auVar16._24_8_ = local_158.u.str.s;
              aVar17.str.s = local_158.u.str.s;
              aVar17.i = local_158.u.i;
              aVar17._16_8_ = local_158.u._16_8_;
              aVar17.mem.disp = local_158.u.mem.disp;
              local_1f0[iVar25].u = aVar17;
              *(undefined1 (*) [32])(local_1f0 + iVar25) = auVar16;
              uVar41 = uVar41 + 1;
            } while (uVar43 != uVar41);
          }
          uVar43 = (uint)local_1f8;
          if (-1 < iVar22) goto LAB_00171ebc;
        }
        MVar24 = change_reg(gen_ctx,&local_1c8,(pMVar39->u).reg,base_reg,MVar21,insn,local_1fc);
        if (MVar24 == 0xffffffff) {
          auVar12._8_8_ = local_1c8._8_8_;
          auVar12._0_8_ = local_1c8.data;
          auVar12._16_8_ = local_1c8.u.i;
          auVar12._24_8_ = local_1c8.u.str.s;
          aVar13.str.s = local_1c8.u.str.s;
          aVar13.i = local_1c8.u.i;
          aVar13._16_8_ = local_1c8.u._16_8_;
          aVar13.mem.disp = local_1c8.u.mem.disp;
          pMVar39->u = aVar13;
          *(undefined1 (*) [32])pMVar39 = auVar12;
        }
        else {
          (pMVar39->u).reg = MVar24;
        }
      }
LAB_00171ebc:
      sVar44 = sVar44 + 1;
    } while (sVar44 != local_1d0);
  }
  pMVar39 = local_1f0;
  iVar22 = 0;
  if (((*(uint *)&insn->field_0x18 & 0xfffffffc) == 0) &&
     (uVar11 = *(undefined8 *)((long)&insn->ops[0].u + 8),
     op1_00._12_4_ = (int)((ulong)*(undefined8 *)&insn->ops[0].field_0x8 >> 0x20),
     op1_00.data = insn->ops[0].data, op1_00._8_4_ = *(undefined4 *)&insn->ops[0].field_0x8,
     op1_00.u.i = insn->ops[0].u.i, op1_00.u.mem.nonalias = (int)uVar11,
     op1_00.u.mem.nloc = (int)((ulong)uVar11 >> 0x20),
     op1_00.u._16_8_ = *(undefined8 *)((long)&insn->ops[0].u + 0x10),
     op1_00.u.mem.disp = insn->ops[0].u.mem.disp,
     iVar25 = MIR_op_eq_p(local_1e0,op1_00,*(MIR_op_t *)(insn + 1)), iVar22 = 0, iVar25 != 0)) {
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("Deleting noop move ",0x13,1,(FILE *)gen_ctx->debug_file);
      pMVar42 = local_1e0;
      MIR_output_insn(local_1e0,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,0);
      fwrite(" which was ",0xb,1,(FILE *)gen_ctx->debug_file);
      (pMVar39->u).i = iStack_118;
      (pMVar39->u).str.s = pcStack_110;
      *(undefined8 *)((long)&pMVar39->u + 0x10) = uStack_108;
      (pMVar39->u).mem.disp = MStack_100;
      pMVar39->data = local_128[0];
      *(void **)&pMVar39->field_0x8 = local_128[1];
      (pMVar39->u).i = iStack_118;
      (pMVar39->u).str.s = pcStack_110;
      insn[1].insn_link.next = pMStack_e8;
      *(undefined8 *)&insn[1].field_0x18 = uStack_e0;
      insn[1].ops[0].data = pvStack_d8;
      *(undefined8 *)&insn[1].ops[0].field_0x8 = uStack_d0;
      insn[1].data = local_f8;
      insn[1].insn_link.prev = pMStack_f0;
      insn[1].insn_link.next = pMStack_e8;
      *(undefined8 *)&insn[1].field_0x18 = uStack_e0;
      MIR_output_insn(pMVar42,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,1);
    }
    if ((((gen_ctx->optimize_level != 0) &&
         (puVar10 = (undefined8 *)insn->data, puVar10 != (undefined8 *)0x0)) &&
        (*(undefined8 **)(puVar10[6] + 0x50) == puVar10)) &&
       (*(undefined8 **)(puVar10[6] + 0x58) == puVar10)) {
      pMVar27 = MIR_new_insn_arr(gen_ctx->ctx,MIR_USE,0,(MIR_op_t *)0x0);
      MIR_insert_insn_before
                (gen_ctx->ctx,gen_ctx->curr_func_item,(MIR_insn_t_conflict)*puVar10,pMVar27);
      add_new_bb_insn(gen_ctx,pMVar27,(bb_t_conflict)puVar10[6],0);
    }
    gen_delete_insn(gen_ctx,insn);
    iVar22 = 1;
  }
  return iVar22;
}

Assistant:

static int rewrite_insn (gen_ctx_t gen_ctx, MIR_insn_t insn, MIR_reg_t base_reg,
                         struct rewrite_data *data) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_type_t type;
  size_t nops, i;
  MIR_op_t *op, mem_op;
#if !MIR_NO_GEN_DEBUG
  MIR_op_t in_op = MIR_new_int_op (ctx, 0),
           out_op = MIR_new_int_op (ctx, 0); /* To remove unitilized warning */
#endif
  MIR_op_mode_t data_mode;
  MIR_reg_t hard_reg, reg;
  int out_p, call_p, addr_reload_p, rld_in_num;
  int out_mem_op_num, in_mem_op_num, other_mem_op_num;
  nops = MIR_insn_nops (ctx, insn);
  out_mem_op_num = in_mem_op_num = -1;
  rld_in_num = 0;
  /* Update live info, save/restore regs living across calls, and check do we need addr reload:
   */
  for (int niter = 0; niter <= 1; niter++) {
    for (i = 0; i < nops; i++) {
      op = &insn->ops[i];
      data_mode = MIR_insn_op_mode (ctx, insn, i, &out_p);
      if (niter == 0 && (!out_p || op->mode == MIR_OP_VAR_MEM)) continue;
      if (niter == 1 && (out_p && op->mode != MIR_OP_VAR_MEM)) continue;
      switch (op->mode) {
      case MIR_OP_VAR:
        if (op->u.var <= MAX_HARD_REG) {
          bitmap_set_bit_p (func_used_hard_regs, op->u.var);
          if (data != NULL) update_live (op->u.var, out_p, data->live);
        } else {
          if (!out_p && VARR_GET (MIR_reg_t, reg_renumber, op->u.var) > MAX_HARD_REG
              && mode2type (data_mode) == MIR_T_I64)
            rld_in_num++;
          if (data != NULL) {
            update_live (op->u.var, out_p, data->live);
            if (bitmap_clear_bit_p (data->regs_to_save, op->u.var)) /* put (slot<-hr) after insn */
              spill_restore_reg (gen_ctx, op->u.var, base_reg, insn, TRUE, FALSE);
          }
        }
        break;
      case MIR_OP_VAR_MEM:
        if (op->u.var_mem.base <= MAX_HARD_REG)
          bitmap_set_bit_p (func_used_hard_regs, op->u.var_mem.base);
        if (op->u.var_mem.index <= MAX_HARD_REG)
          bitmap_set_bit_p (func_used_hard_regs, op->u.var_mem.index);
        if (op->u.var_mem.base != MIR_NON_VAR && op->u.var_mem.index != MIR_NON_VAR
            && op->u.var_mem.base > MAX_HARD_REG && op->u.var_mem.index > MAX_HARD_REG
            && VARR_GET (MIR_reg_t, reg_renumber, op->u.var_mem.base) > MAX_HARD_REG
            && VARR_GET (MIR_reg_t, reg_renumber, op->u.var_mem.index) > MAX_HARD_REG) {
          other_mem_op_num = -1;
          if (out_p) {
            gen_assert (out_mem_op_num < 0);
            out_mem_op_num = (int) i;
            if (in_mem_op_num >= 0) other_mem_op_num = in_mem_op_num;
          } else {
            gen_assert (in_mem_op_num < 0);
            in_mem_op_num = (int) i;
            if (out_mem_op_num >= 0) other_mem_op_num = out_mem_op_num;
          }
          if (other_mem_op_num < 0
              || op->u.var_mem.base != insn->ops[other_mem_op_num].u.var_mem.base
              || op->u.var_mem.index != insn->ops[other_mem_op_num].u.var_mem.index)
            rld_in_num += 2;
        }
        if (data != NULL) {
          if (op->u.var_mem.base != MIR_NON_VAR) {
            update_live (op->u.var_mem.base, FALSE, data->live);
            if (op->u.var_mem.base > MAX_HARD_REG) {
              if (bitmap_clear_bit_p (data->regs_to_save,
                                      op->u.var_mem.base)) /* put slot<-hr after */
                spill_restore_reg (gen_ctx, op->u.var_mem.base, base_reg, insn, TRUE, FALSE);
            }
          }
          if (op->u.var_mem.index != MIR_NON_VAR) {
            update_live (op->u.var_mem.index, FALSE, data->live);
            if (op->u.var_mem.index > MAX_HARD_REG) {
              if (bitmap_clear_bit_p (data->regs_to_save,
                                      op->u.var_mem.index)) /* put slot<-hr after */
                spill_restore_reg (gen_ctx, op->u.var_mem.index, base_reg, insn, TRUE, FALSE);
            }
          }
        }
        break;
      default: /* do nothing */ break;
      }
    }
    if (data != NULL && niter == 0) { /* right after processing outputs */
      MIR_reg_t early_clobbered_hard_reg1, early_clobbered_hard_reg2;
      target_get_early_clobbered_hard_regs (insn, &early_clobbered_hard_reg1,
                                            &early_clobbered_hard_reg2);
      if (early_clobbered_hard_reg1 != MIR_NON_VAR)
        update_live (early_clobbered_hard_reg1, TRUE, data->live);
      if (early_clobbered_hard_reg2 != MIR_NON_VAR)
        update_live (early_clobbered_hard_reg2, TRUE, data->live);
      if (MIR_call_code_p (insn->code)) {
        size_t nel;
        bb_insn_t bb_insn = insn->data;
        bitmap_iterator_t bi;
        FOREACH_BITMAP_BIT (bi, call_used_hard_regs[MIR_T_UNDEF], nel) {
          update_live ((MIR_reg_t) nel, TRUE, data->live);
        }
        FOREACH_BITMAP_BIT (bi, bb_insn->call_hard_reg_args, nel) {
          update_live ((MIR_reg_t) nel, FALSE, data->live);
        }
        FOREACH_BITMAP_BIT (bi, data->live, nel) {
          if (nel <= MAX_HARD_REG) continue;
          reg = (MIR_reg_t) nel;
          if (bitmap_bit_p (data->bb->spill_gen, reg)) continue; /* will be spilled in split */
          MIR_reg_t loc = VARR_GET (MIR_reg_t, reg_renumber, reg);
          if (loc > MAX_HARD_REG) continue;
          type = MIR_reg_type (gen_ctx->ctx, reg - MAX_HARD_REG, curr_func_item->u.func);
          int nregs = target_locs_num (loc, type);
          if (hreg_in_bitmap_p (loc, type, nregs, call_used_hard_regs[MIR_T_UNDEF])
              && bitmap_set_bit_p (data->regs_to_save, reg)) /* put (hr<-slot) after call */
            spill_restore_reg (gen_ctx, reg, base_reg, insn, TRUE, TRUE);
        }
      }
    }
  }
  addr_reload_p = rld_in_num > 2;
  out_reloads_num = in_reloads_num = 0;
  if (addr_reload_p) { /* not enough 2 temp int hard regs: address reload: */
    reload_addr (gen_ctx, insn, in_mem_op_num, out_mem_op_num, base_reg);
    get_reload_hreg (gen_ctx, MIR_NON_VAR, MIR_T_I64,
                     FALSE); /* reserve the 1st int temp hard reg */
  }
  if (MIR_addr_code_p (insn->code)) transform_addr (gen_ctx, insn, base_reg);
  call_p = MIR_call_code_p (insn->code);
  for (i = 0; i < nops; i++) {
    op = &insn->ops[i];
    data_mode = MIR_insn_op_mode (ctx, insn, i, &out_p);
    DEBUG (2, {
      if (out_p)
        out_op = *op; /* we don't care about multiple call outputs here */
      else
        in_op = *op;
    });
    switch (op->mode) {
    case MIR_OP_VAR:
      if (op->u.var <= MAX_HARD_REG) break;
      if (data_mode == MIR_OP_VAR) {
        gen_assert (insn->code == MIR_USE || (MIR_addr_code_p (insn->code) && i == 1));
        type = MIR_reg_type (ctx, op->u.var - MAX_HARD_REG, curr_func_item->u.func);
        data_mode = type == MIR_T_F    ? MIR_OP_FLOAT
                    : type == MIR_T_D  ? MIR_OP_DOUBLE
                    : type == MIR_T_LD ? MIR_OP_LDOUBLE
                                       : MIR_OP_INT;
      }
      MIR_reg_t loc = VARR_GET (MIR_reg_t, reg_renumber, op->u.var);
      if (!MIR_addr_code_p (insn->code) && i == 0 && loc > MAX_HARD_REG
          && try_spilled_reg_mem (gen_ctx, insn, (int) i, loc, base_reg))
        break;
      hard_reg = change_reg (gen_ctx, &mem_op, op->u.var, base_reg, data_mode, insn, out_p);
      if (hard_reg == MIR_NON_VAR) { /* we don't use hard regs for this type reg (e.g. ldouble) */
        *op = mem_op;
      } else {
        op->u.var = hard_reg;
      }
      break;
    case MIR_OP_VAR_MEM:
      if (call_p && MIR_blk_type_p (op->u.var_mem.type)) break;
      if (op->u.var_mem.base > MAX_HARD_REG && op->u.var_mem.base != MIR_NON_VAR) {
        op->u.var_mem.base
          = change_reg (gen_ctx, &mem_op, op->u.var_mem.base, base_reg, MIR_OP_INT, insn, FALSE);
        gen_assert (op->u.var_mem.base != MIR_NON_VAR); /* we can always use GP regs */
      }
      if (op->u.var_mem.index > MAX_HARD_REG && op->u.var_mem.index != MIR_NON_VAR) {
        op->u.var_mem.index
          = change_reg (gen_ctx, &mem_op, op->u.var_mem.index, base_reg, MIR_OP_INT, insn, FALSE);
        gen_assert (op->u.var_mem.index != MIR_NON_VAR); /* we can always use GP regs */
      }
      break;
    default: /* do nothing */ break;
    }
  }
  if (move_code_p (insn->code)) {
    if (MIR_op_eq_p (ctx, insn->ops[0], insn->ops[1])) {
      DEBUG (2, {
        fprintf (debug_file, "Deleting noop move ");
        MIR_output_insn (ctx, debug_file, insn, curr_func_item->u.func, FALSE);
        fprintf (debug_file, " which was ");
        insn->ops[0] = out_op;
        insn->ops[1] = in_op;
        MIR_output_insn (ctx, debug_file, insn, curr_func_item->u.func, TRUE);
      });
      bb_insn_t bb_insn;
      if (optimize_level > 0 && (bb_insn = insn->data) != NULL
          && DLIST_HEAD (bb_insn_t, bb_insn->bb->bb_insns) == bb_insn
          && DLIST_TAIL (bb_insn_t, bb_insn->bb->bb_insns) == bb_insn) { /* avoid empty bb */
        MIR_insn_t nop = MIR_new_insn_arr (gen_ctx->ctx, MIR_USE, 0, NULL);
        MIR_insert_insn_before (gen_ctx->ctx, curr_func_item, bb_insn->insn, nop);
        add_new_bb_insn (gen_ctx, nop, bb_insn->bb, FALSE);
      }
      gen_delete_insn (gen_ctx, insn);
      return 1;
    }
  }
  return 0;
}